

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O0

kStatus __thiscall gnilk::Log::Error<char_const*>(Log *this,char *arguments)

{
  bool bVar1;
  int iVar2;
  kStatus kVar3;
  char **fmt;
  undefined1 local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  char *arguments_local;
  Log *this_local;
  
  if (((this->isEnabled & 1U) != 0) &&
     (str.field_2._8_8_ = arguments, bVar1 = WithinRange(this,kError), bVar1)) {
    ::fmt::v10::sprintf<char_const*,,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (v10 *)(str.field_2._M_local_buf + 8),fmt);
    iVar2 = SendLogMessage(this,kError,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_40);
    kVar3 = kSendError;
    if (0 < iVar2) {
      kVar3 = kOk;
    }
    std::__cxx11::string::~string((string *)local_40);
    return kVar3;
  }
  return kFiltered;
}

Assistant:

inline kStatus Error(T... arguments) const {
            if (!(isEnabled && WithinRange(kError))) return kStatus::kFiltered;
            auto str = fmt::sprintf(arguments...);
            return (SendLogMessage(kError, str) > 0) ? kStatus::kOk : kStatus::kSendError;
        }